

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-predicate.c
# Opt level: O0

_Bool monster_can_be_scared(monster *mon)

{
  monster_group_role mVar1;
  _Bool _Var2;
  uint32_t uVar3;
  wchar_t local_1c;
  wchar_t count;
  monster *mon_local;
  
  _Var2 = flag_has_dbg(mon->race->flags,0xc,0x5a,"mon->race->flags","RF_NO_FEAR");
  if (_Var2) {
    mon_local._7_1_ = false;
  }
  else {
    mVar1 = mon->group_info[0].role;
    if (mVar1 == MON_GROUP_SERVANT) {
      uVar3 = Rand_div(3);
      mon_local._7_1_ = uVar3 != 0;
    }
    else if (mVar1 == MON_GROUP_BODYGUARD) {
      mon_local._7_1_ = false;
    }
    else {
      local_1c = monster_primary_group_size((chunk *)cave,mon);
      do {
        local_1c = local_1c + L'\xffffffff';
        if (local_1c == L'\0') {
          return true;
        }
        uVar3 = Rand_div(0x14);
      } while (uVar3 != 0);
      mon_local._7_1_ = false;
    }
  }
  return mon_local._7_1_;
}

Assistant:

bool monster_can_be_scared(const struct monster *mon)
{
	if (rf_has(mon->race->flags, RF_NO_FEAR)) return false;
	switch (mon->group_info[PRIMARY_GROUP].role) {
		case MON_GROUP_BODYGUARD: return false;
		case MON_GROUP_SERVANT:	return one_in_(3) ? false : true;
		default: {
			int count = monster_primary_group_size(cave, mon) - 1;
			while (count--) {
				if (one_in_(20)) return false;
			}
		}
	}
	return true;
}